

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  ImGuiWindow *window_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  ImGuiViewport *pIVar8;
  ImGuiWindow **ppIVar9;
  char cVar10;
  undefined1 extraout_XMM0_Ba;
  char cVar11;
  undefined1 extraout_XMM0_Bb;
  char cVar12;
  undefined1 extraout_XMM0_Bc;
  char cVar13;
  undefined1 extraout_XMM0_Bd;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  ImGuiContext *unaff_retaddr;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiContext *g;
  uint in_stack_ffffffffffffffdc;
  uint uVar26;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar27;
  undefined2 in_stack_fffffffffffffff4;
  byte in_stack_fffffffffffffff6;
  byte in_stack_fffffffffffffff7;
  ImGuiContext *pIVar28;
  
  iVar27 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    pIVar28 = GImGui;
    CallContextHooks(unaff_retaddr,(ImGuiContextHookType)((ulong)GImGui >> 0x20));
    ErrorCheckEndFrameSanityChecks();
    if ((pIVar28->IO).SetPlatformImeDataFn !=
        (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) {
      cVar10 = -((pIVar28->PlatformImeData).WantVisible ==
                (pIVar28->PlatformImeDataPrev).WantVisible);
      cVar11 = -((pIVar28->PlatformImeData).field_0x1 == (pIVar28->PlatformImeDataPrev).field_0x1);
      cVar12 = -((pIVar28->PlatformImeData).field_0x2 == (pIVar28->PlatformImeDataPrev).field_0x2);
      cVar13 = -((pIVar28->PlatformImeData).field_0x3 == (pIVar28->PlatformImeDataPrev).field_0x3);
      cVar14 = -(*(char *)&(pIVar28->PlatformImeData).InputPos.x ==
                *(char *)&(pIVar28->PlatformImeDataPrev).InputPos.x);
      cVar15 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputPos.x + 1) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputPos.x + 1));
      cVar16 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputPos.x + 2) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputPos.x + 2));
      cVar17 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputPos.x + 3) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputPos.x + 3));
      cVar18 = -(*(char *)&(pIVar28->PlatformImeData).InputPos.y ==
                *(char *)&(pIVar28->PlatformImeDataPrev).InputPos.y);
      cVar19 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputPos.y + 1) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputPos.y + 1));
      cVar20 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputPos.y + 2) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputPos.y + 2));
      cVar21 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputPos.y + 3) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputPos.y + 3));
      cVar22 = -(*(char *)&(pIVar28->PlatformImeData).InputLineHeight ==
                *(char *)&(pIVar28->PlatformImeDataPrev).InputLineHeight);
      cVar23 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputLineHeight + 1) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputLineHeight + 1));
      cVar24 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputLineHeight + 2) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputLineHeight + 2));
      bVar25 = -(*(char *)((long)&(pIVar28->PlatformImeData).InputLineHeight + 3) ==
                *(char *)((long)&(pIVar28->PlatformImeDataPrev).InputLineHeight + 3));
      auVar1[1] = cVar11;
      auVar1[0] = cVar10;
      auVar1[2] = cVar12;
      auVar1[3] = cVar13;
      auVar1[4] = cVar14;
      auVar1[5] = cVar15;
      auVar1[6] = cVar16;
      auVar1[7] = cVar17;
      auVar1[8] = cVar18;
      auVar1[9] = cVar19;
      auVar1[10] = cVar20;
      auVar1[0xb] = cVar21;
      auVar1[0xc] = cVar22;
      auVar1[0xd] = cVar23;
      auVar1[0xe] = cVar24;
      auVar1[0xf] = bVar25;
      auVar2[1] = cVar11;
      auVar2[0] = cVar10;
      auVar2[2] = cVar12;
      auVar2[3] = cVar13;
      auVar2[4] = cVar14;
      auVar2[5] = cVar15;
      auVar2[6] = cVar16;
      auVar2[7] = cVar17;
      auVar2[8] = cVar18;
      auVar2[9] = cVar19;
      auVar2[10] = cVar20;
      auVar2[0xb] = cVar21;
      auVar2[0xc] = cVar22;
      auVar2[0xd] = cVar23;
      auVar2[0xe] = cVar24;
      auVar2[0xf] = bVar25;
      auVar6[1] = cVar13;
      auVar6[0] = cVar12;
      auVar6[2] = cVar14;
      auVar6[3] = cVar15;
      auVar6[4] = cVar16;
      auVar6[5] = cVar17;
      auVar6[6] = cVar18;
      auVar6[7] = cVar19;
      auVar6[8] = cVar20;
      auVar6[9] = cVar21;
      auVar6[10] = cVar22;
      auVar6[0xb] = cVar23;
      auVar6[0xc] = cVar24;
      auVar6[0xd] = bVar25;
      auVar5[1] = cVar14;
      auVar5[0] = cVar13;
      auVar5[2] = cVar15;
      auVar5[3] = cVar16;
      auVar5[4] = cVar17;
      auVar5[5] = cVar18;
      auVar5[6] = cVar19;
      auVar5[7] = cVar20;
      auVar5[8] = cVar21;
      auVar5[9] = cVar22;
      auVar5[10] = cVar23;
      auVar5[0xb] = cVar24;
      auVar5[0xc] = bVar25;
      auVar4[1] = cVar15;
      auVar4[0] = cVar14;
      auVar4[2] = cVar16;
      auVar4[3] = cVar17;
      auVar4[4] = cVar18;
      auVar4[5] = cVar19;
      auVar4[6] = cVar20;
      auVar4[7] = cVar21;
      auVar4[8] = cVar22;
      auVar4[9] = cVar23;
      auVar4[10] = cVar24;
      auVar4[0xb] = bVar25;
      auVar3[1] = cVar16;
      auVar3[0] = cVar15;
      auVar3[2] = cVar17;
      auVar3[3] = cVar18;
      auVar3[4] = cVar19;
      auVar3[5] = cVar20;
      auVar3[6] = cVar21;
      auVar3[7] = cVar22;
      auVar3[8] = cVar23;
      auVar3[9] = cVar24;
      auVar3[10] = bVar25;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(cVar22,
                                                  CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(cVar19,
                                                  CONCAT12(cVar18,CONCAT11(cVar17,cVar16))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(cVar22,
                                                  CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(cVar19,
                                                  CONCAT11(cVar18,cVar17)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar25 >> 7) << 0xf) != 0xffff) {
        in_stack_ffffffffffffffe0 = (ImVector<ImGuiWindow_*> *)(pIVar28->IO).SetPlatformImeDataFn;
        pIVar8 = GetMainViewport();
        (*(code *)in_stack_ffffffffffffffe0)(pIVar8,&pIVar28->PlatformImeData);
      }
    }
    pIVar28->WithinFrameScopeWithImplicitWindow = false;
    if ((pIVar28->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((pIVar28->CurrentWindow->WriteAccessed & 1U) == 0)) {
      pIVar28->CurrentWindow->Active = false;
    }
    End();
    NavEndFrame();
    if ((pIVar28->DragDropActive & 1U) != 0) {
      in_stack_fffffffffffffff7 = (pIVar28->DragDropPayload).Delivery & 1;
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
      if ((pIVar28->DragDropPayload).DataFrameCount + 1 < pIVar28->FrameCount) {
        uVar26 = (uint)CONCAT12(1,(short)in_stack_ffffffffffffffdc);
        if ((pIVar28->DragDropSourceFlags & 0x20U) == 0) {
          bVar7 = IsMouseDown(pIVar28->DragDropMouseButton);
          uVar26 = (uint)(uint3)(CONCAT12(bVar7,(short)uVar26) ^ 0xff0000);
        }
        in_stack_ffffffffffffffdc = CONCAT13((char)(uVar26 >> 0x10),(int3)uVar26);
      }
      in_stack_fffffffffffffff6 = (byte)(in_stack_ffffffffffffffdc >> 0x18) & 1;
      if (((in_stack_fffffffffffffff7 & 1) != 0) || ((in_stack_ffffffffffffffdc & 0x1000000) != 0))
      {
        ClearDragDrop();
      }
    }
    if ((((pIVar28->DragDropActive & 1U) != 0) &&
        (pIVar28->DragDropSourceFrameCount < pIVar28->FrameCount)) &&
       ((pIVar28->DragDropSourceFlags & 1U) == 0)) {
      pIVar28->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar28->DragDropWithinSource = false;
    }
    pIVar28->WithinFrameScope = false;
    pIVar28->FrameCountEnded = pIVar28->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    ImVector<ImGuiWindow_*>::resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    ImVector<ImGuiWindow_*>::reserve
              ((ImVector<ImGuiWindow_*> *)
               CONCAT17(in_stack_fffffffffffffff7,
                        CONCAT16(in_stack_fffffffffffffff6,
                                 CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0))),
               iVar27);
    for (iVar27 = 0; iVar27 != (pIVar28->Windows).Size; iVar27 = iVar27 + 1) {
      ppIVar9 = ImVector<ImGuiWindow_*>::operator[](&pIVar28->Windows,iVar27);
      window_00 = *ppIVar9;
      if (((window_00->Active & 1U) == 0) || ((window_00->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer
                  ((ImVector<ImGuiWindow_*> *)
                   CONCAT17(in_stack_fffffffffffffff7,
                            CONCAT16(in_stack_fffffffffffffff6,
                                     CONCAT24(in_stack_fffffffffffffff4,iVar27))),window_00);
      }
    }
    ImVector<ImGuiWindow_*>::swap(&pIVar28->Windows,&pIVar28->WindowsTempSortBuffer);
    (pIVar28->IO).MetricsActiveWindows = pIVar28->WindowsActiveCount;
    ((pIVar28->IO).Fonts)->Locked = false;
    (pIVar28->IO).MouseWheelH =
         (float)(CONCAT13(extraout_XMM0_Bd,
                          CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
                CONCAT13(extraout_XMM0_Bd,
                         CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))));
    (pIVar28->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    memset((pIVar28->IO).NavInputs,0,0x50);
    CallContextHooks(unaff_retaddr,(ImGuiContextHookType)((ulong)pIVar28 >> 0x20));
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
        g.IO.SetPlatformImeDataFn(GetMainViewport(), &g.PlatformImeData);

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}